

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O1

void getUserParamsFromOptions
               (HighsOptions *options,cupdlp_bool *ifChangeIntParam,cupdlp_int *intParam,
               cupdlp_bool *ifChangeFloatParam,cupdlp_float *floatParam)

{
  cupdlp_int cVar1;
  
  ifChangeIntParam[8] = false;
  ifChangeIntParam[9] = false;
  ifChangeIntParam[10] = false;
  ifChangeIntParam[0xb] = false;
  ifChangeIntParam[0] = false;
  ifChangeIntParam[1] = false;
  ifChangeIntParam[2] = false;
  ifChangeIntParam[3] = false;
  ifChangeIntParam[4] = false;
  ifChangeIntParam[5] = false;
  ifChangeIntParam[6] = false;
  ifChangeIntParam[7] = false;
  ifChangeFloatParam[0] = false;
  ifChangeFloatParam[1] = false;
  ifChangeFloatParam[2] = false;
  ifChangeFloatParam[3] = false;
  ifChangeFloatParam[4] = false;
  ifChangeFloatParam[5] = false;
  *ifChangeIntParam = true;
  *intParam = (options->super_HighsOptionsStruct).pdlp_iteration_limit;
  ifChangeIntParam[8] = true;
  cVar1 = 2 - (uint)((options->super_HighsOptionsStruct).log_dev_level == 0);
  if ((options->super_HighsOptionsStruct).output_flag == false) {
    cVar1 = 0;
  }
  intParam[8] = cVar1;
  ifChangeIntParam[1] = true;
  intParam[1] = (uint)(options->super_HighsOptionsStruct).pdlp_scaling;
  ifChangeFloatParam[1] = true;
  floatParam[1] = (options->super_HighsOptionsStruct).primal_feasibility_tolerance;
  ifChangeFloatParam[2] = true;
  floatParam[2] = (options->super_HighsOptionsStruct).dual_feasibility_tolerance;
  ifChangeFloatParam[3] = true;
  floatParam[3] = (options->super_HighsOptionsStruct).pdlp_d_gap_tol;
  ifChangeFloatParam[5] = true;
  floatParam[5] = (options->super_HighsOptionsStruct).time_limit;
  ifChangeIntParam[4] = true;
  intParam[4] = (options->super_HighsOptionsStruct).pdlp_e_restart_method;
  ifChangeIntParam[0xb] = true;
  intParam[0xb] = (options->super_HighsOptionsStruct).pdlp_native_termination ^ 1;
  return;
}

Assistant:

void getUserParamsFromOptions(const HighsOptions& options,
                              cupdlp_bool* ifChangeIntParam,
                              cupdlp_int* intParam,
                              cupdlp_bool* ifChangeFloatParam,
                              cupdlp_float* floatParam) {
  for (cupdlp_int i = 0; i < N_INT_USER_PARAM; ++i) ifChangeIntParam[i] = false;
  for (cupdlp_int i = 0; i < N_FLOAT_USER_PARAM; ++i)
    ifChangeFloatParam[i] = false;
  // Assume all PDLP-related options in HiGHS cause changes
  ifChangeIntParam[N_ITER_LIM] = true;
  // If HiGHS is using 64-bit integers, then the default value of
  // options.pdlp_iteration_limit is kHighsIInf, so copying this to
  // intParam[N_ITER_LIM] will overflow.
  intParam[N_ITER_LIM] = cupdlp_int(options.pdlp_iteration_limit > kHighsIInf32
                                        ? kHighsIInf32
                                        : options.pdlp_iteration_limit);
  //
  ifChangeIntParam[N_LOG_LEVEL] = true;
  intParam[N_LOG_LEVEL] = getCupdlpLogLevel(options);
  //
  ifChangeIntParam[IF_SCALING] = true;
  intParam[IF_SCALING] = options.pdlp_scaling ? 1 : 0;
  //
  ifChangeFloatParam[D_PRIMAL_TOL] = true;
  floatParam[D_PRIMAL_TOL] = options.primal_feasibility_tolerance;
  //
  ifChangeFloatParam[D_DUAL_TOL] = true;
  floatParam[D_DUAL_TOL] = options.dual_feasibility_tolerance;
  //
  ifChangeFloatParam[D_GAP_TOL] = true;
  floatParam[D_GAP_TOL] = options.pdlp_d_gap_tol;
  //
  ifChangeFloatParam[D_TIME_LIM] = true;
  floatParam[D_TIME_LIM] = options.time_limit;
  //
  ifChangeIntParam[E_RESTART_METHOD] = true;
  intParam[E_RESTART_METHOD] = int(options.pdlp_e_restart_method);
  //

  // for the moment only native termination is allowed with GPU
#ifdef CUPDLP_CPU 
#ifdef CUPDLP_FORCE_NATIVE
  ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = false;
  if (!options.pdlp_native_termination) {
    printf("Warning: CUPDLP_FORCE_NATIVE is on. Forcing pdlp_native_termination=on.\n");
  }
#else
  ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = true;
  intParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = !options.pdlp_native_termination;
#endif
#else
  ifChangeIntParam[I_INF_NORM_ABS_LOCAL_TERMINATION] = false;

  if (intParam[N_LOG_LEVEL]) {
    if (!options.pdlp_native_termination) {
      printf("GPU only supports pdlp_native_termination=on. Forcing pdlp_native_termination=on.\n");
    }
  }
#endif
}